

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O1

void __thiscall findstr::searchsequential(findstr *this,filehandle *f,string *origin)

{
  bool bVar1;
  long *plVar2;
  int __fd;
  void *__s;
  ssize_t sVar3;
  void *__src;
  value_type *__val;
  void *__buf;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  size_t __n;
  shared_ptr<SearchBase> searcher;
  long local_90;
  undefined8 *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  int *local_60;
  void *local_58;
  string *local_50;
  long local_48;
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this->nameprinted = false;
  this->matchcount = 0;
  local_50 = origin;
  __s = operator_new(0x100000);
  memset(__s,0,0x100000);
  makesearcher((findstr *)&local_40);
  local_60 = &this->matchcount;
  local_48 = (long)__s + 0x100000;
  local_58 = (void *)((long)__s + 0x80000);
  local_90 = 0;
  __buf = __s;
  do {
    __fd = filehandle::fh(f);
    iVar5 = (int)local_48 - (int)__buf;
    sVar3 = read(__fd,__buf,(long)iVar5);
    plVar2 = local_40;
    uVar4 = (uint)sVar3;
    if (uVar4 == 0) {
      bVar1 = true;
      if (this->readcontinuous == true) {
        usleep(100);
        bVar1 = false;
      }
    }
    else {
      bVar1 = true;
      if (-1 < (int)uVar4 && (int)uVar4 <= iVar5) {
        local_88 = (undefined8 *)0x0;
        uStack_80 = 0;
        local_78 = (code *)0x0;
        pcStack_70 = (code *)0x0;
        local_88 = (undefined8 *)operator_new(0x20);
        pvVar6 = (void *)((ulong)(uVar4 & 0x7fffffff) + (long)__buf);
        *local_88 = local_50;
        local_88[1] = __s;
        local_88[2] = local_90;
        local_88[3] = this;
        pcStack_70 = std::
                     _Function_handler<bool_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nlitsme[P]findstr/findstr.cpp:571:59)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nlitsme[P]findstr/findstr.cpp:571:59)>
                   ::_M_manager;
        __src = (void *)(**(code **)(*plVar2 + 0x10))(plVar2,__s,pvVar6,&local_88);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,3);
        }
        if ((__src != (void *)0x0) && (this->matchstart == false)) {
          if ((long)__src - (long)__s < 0x80000) {
            __src = local_58;
          }
          __buf = __s;
          if (__src < pvVar6) {
            __n = (long)pvVar6 - (long)__src;
            memcpy(__s,__src,__n);
            __buf = (void *)((long)__s + __n);
            uVar4 = uVar4 - (int)__n;
          }
          local_90 = local_90 + (int)uVar4;
          bVar1 = false;
        }
      }
    }
  } while (!bVar1);
  if (this->count_only == true) {
    fprint<int&,char_const(&)[2]>(_stdout,"%6d %s\n",local_60,(char (*) [2])"-");
  }
  if (this->nameprinted == true) {
    fprint<>(_stdout,"\n");
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  operator_delete(__s,0x100000);
  return;
}

Assistant:

void searchsequential(filehandle& f, const std::string& origin)
    {
        //printf("searching stdin\n");
        // see: http://www.boost.org/doc/libs/1_52_0/libs/regex/doc/html/boost_regex/partial_matches.html

        nameprinted = false;
        matchcount = 0;

        std::vector<char> buf(0x100000);
        char *bufstart = &buf.front();
        char *bufend = bufstart + buf.size();
        uint64_t offset = 0;

        auto searcher = makesearcher();

        char *readptr = bufstart;

        while (true)
        {
            int needed = bufend - readptr;
            //print("%08x ; %x: needed = %d -> %p .. %p .. %p\n", offset, lseek(f, 0, 1), needed, bufstart, readptr, bufend);
            int n = read(f, readptr, needed);
            if (n == 0) {
                if (readcontinuous) {
                    //printf("stdin: waiting for more\n");
#ifdef _WIN32
                    Sleep(10);
#else
                    usleep(100);
#endif
                    continue;
                }
                //print("read empty(need=%d), pos=%d\n", needed, lseek(f, 0, 1));
                break;
            }
            else if (n > needed || n < 0)
            {
                //perror("read");
                //print("n=%d\n", n);
                break;
            }

            char *readend = readptr + n;
            const char *partial;

            partial = searcher->search(bufstart, readend, [&origin, bufstart, offset, this](const char *first, const char *last)->bool {
                return writeresult(origin, bufstart, offset, first, last);
            });
            if (partial==NULL)  // writeresult told searcher to stop
                break;
            if (matchstart)
                break;

            // avoid too large partial matches
            if (partial - bufstart < (int)buf.size()/2)
                partial = bufstart + buf.size()/2;

            // relocate data for partial matches
            if (partial < readend) {
                memcpy(bufstart, partial, readend - partial);
                readptr = bufstart + (readend - partial);
                n -= (readend - partial);
            }
            else {
                readptr = bufstart;
            }

            offset += n;
        }
        if (count_only)
            print("%6d %s\n", matchcount, "-");
        if (nameprinted)
            print("\n");
    }